

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iso8601.c
# Opt level: O0

_Bool get_tok(char *terminals,char **ptr,int32_t *remaining,char **out,int32_t *out_len)

{
  _Bool _Var1;
  byte bVar2;
  char *pcStack_38;
  _Bool found_terminal;
  char *terminal;
  int32_t *out_len_local;
  char **out_local;
  int32_t *remaining_local;
  char **ptr_local;
  char *terminals_local;
  
  _Var1 = false;
  if (*remaining == 0) {
    *out = "";
    *out_len = 0;
  }
  *out = *ptr;
  *out_len = -1;
  do {
    bVar2 = 0;
    if (*remaining != 0) {
      bVar2 = _Var1 ^ 1;
    }
    pcStack_38 = terminals;
    if (bVar2 == 0) {
      if (_Var1 == false) {
        *out_len = *out_len + 1;
      }
      return _Var1;
    }
    for (; *pcStack_38 != '\0'; pcStack_38 = pcStack_38 + 1) {
      if (**ptr == *pcStack_38) {
        _Var1 = true;
        break;
      }
    }
    *ptr = *ptr + 1;
    *remaining = *remaining + -1;
    *out_len = *out_len + 1;
  } while( true );
}

Assistant:

static bool
get_tok (const char *terminals,
         const char **ptr,
         int32_t *remaining,
         const char **out,
         int32_t *out_len)
{
   const char *terminal;
   bool found_terminal = false;

   if (!*remaining) {
      *out = "";
      *out_len = 0;
   }

   *out = *ptr;
   *out_len = -1;

   for (; *remaining && !found_terminal;
        (*ptr)++, (*remaining)--, (*out_len)++) {
      for (terminal = terminals; *terminal; terminal++) {
         if (**ptr == *terminal) {
            found_terminal = true;
            break;
         }
      }
   }

   if (!found_terminal) {
      (*out_len)++;
   }

   return found_terminal;
}